

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fountain.c
# Opt level: O0

void dryup(xchar x,xchar y,boolean isyou)

{
  boolean bVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  monst *local_18;
  monst *mtmp;
  boolean isyou_local;
  xchar y_local;
  xchar x_local;
  
  if ((level->locations[x][y].typ == '\x1c') &&
     ((iVar3 = rn2(3), iVar3 == 0 || ((*(uint *)&level->locations[x][y].field_0x6 >> 4 & 2) != 0))))
  {
    if ((isyou == '\0') ||
       ((bVar1 = in_town((int)x,(int)y), bVar1 == '\0' ||
        ((*(uint *)&level->locations[x][y].field_0x6 >> 4 & 2) != 0)))) {
      if (((isyou == '\0') || (flags.debug == '\0')) ||
         (cVar2 = yn_function("Dry up fountain?","yn",'n'), cVar2 != 'n')) {
        level->locations[x][y].typ = '\x19';
        *(uint *)&level->locations[x][y].field_0x6 =
             *(uint *)&level->locations[x][y].field_0x6 & 0xfffffe0f;
        *(uint *)&level->locations[x][y].field_0x6 =
             *(uint *)&level->locations[x][y].field_0x6 & 0xfffffdff;
        if ((viz_array[y][x] & 2U) != 0) {
          pline("The fountain dries up!");
        }
        newsym((int)x,(int)y);
        (level->flags).nfountains = (level->flags).nfountains + 0xff;
        if ((isyou != '\0') && (bVar1 = in_town((int)x,(int)y), bVar1 != '\0')) {
          angry_guards('\0');
        }
      }
    }
    else {
      *(uint *)&level->locations[x][y].field_0x6 =
           *(uint *)&level->locations[x][y].field_0x6 & 0xfffffe0f |
           (*(uint *)&level->locations[x][y].field_0x6 >> 4 & 0x1f | 2) << 4;
      for (local_18 = level->monlist; local_18 != (monst *)0x0; local_18 = local_18->nmon) {
        if ((0 < local_18->mhp) &&
           ((((local_18->data == mons + 0x125 || (local_18->data == mons + 0x126)) &&
             ((viz_array[local_18->my][local_18->mx] & 1U) != 0)) &&
            ((*(uint *)&local_18->field_0x60 >> 0x16 & 1) != 0)))) {
          pcVar4 = Amonnam(local_18);
          pline("%s yells:",pcVar4);
          verbalize("Hey, stop using that fountain!");
          break;
        }
      }
      if (local_18 == (monst *)0x0) {
        pline("The flow reduces to a trickle.");
      }
    }
  }
  return;
}

Assistant:

void dryup(xchar x, xchar y, boolean isyou)
{
	if (IS_FOUNTAIN(level->locations[x][y].typ) &&
	    (!rn2(3) || FOUNTAIN_IS_WARNED(x,y))) {
		if (isyou && in_town(x, y) && !FOUNTAIN_IS_WARNED(x,y)) {
			struct monst *mtmp;
			SET_FOUNTAIN_WARNED(x,y);
			/* Warn about future fountain use. */
			for (mtmp = level->monlist; mtmp; mtmp = mtmp->nmon) {
			    if (DEADMONSTER(mtmp)) continue;
			    if ((mtmp->data == &mons[PM_WATCHMAN] ||
				mtmp->data == &mons[PM_WATCH_CAPTAIN]) &&
			       couldsee(mtmp->mx, mtmp->my) &&
			       mtmp->mpeaceful) {
				pline("%s yells:", Amonnam(mtmp));
				verbalize("Hey, stop using that fountain!");
				break;
			    }
			}
			/* You can see or hear this effect */
			if (!mtmp) pline("The flow reduces to a trickle.");
			return;
		}
		
		if (isyou && wizard) {
			if (yn("Dry up fountain?") == 'n')
				return;
		}
		
		/* replace the fountain with ordinary floor */
		level->locations[x][y].typ = ROOM;
		level->locations[x][y].looted = 0;
		level->locations[x][y].blessedftn = 0;
		if (cansee(x,y)) pline("The fountain dries up!");
		/* The location is seen if the hero/monster is invisible */
		/* or felt if the hero is blind.			 */
		newsym(x, y);
		level->flags.nfountains--;
		if (isyou && in_town(x, y))
		    angry_guards(FALSE);
	}
}